

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O0

wchar_t borg_freedom(wchar_t y,wchar_t x)

{
  wchar_t wVar1;
  wchar_t local_18;
  wchar_t f;
  wchar_t d;
  wchar_t x_local;
  wchar_t y_local;
  
  local_18 = L'\0';
  if ((borg.trait[0x69] == 0) && (track_more.num != 0)) {
    wVar1 = borg_distance(y << 1,x << 1,*track_more.y << 1,*track_more.x << 1);
    local_18 = L'Ϩ' - wVar1;
    if (wVar1 < L'\x04') {
      local_18 = wVar1 * -500 + 2000 + local_18;
    }
  }
  if ((borg.trait[0x69] != 0) && (track_less.num != 0)) {
    wVar1 = borg_distance(y << 1,x << 1,*track_less.y << 1,*track_less.x << 1);
    local_18 = (1000 - wVar1) + local_18;
    if (wVar1 < L'\x04') {
      local_18 = wVar1 * -500 + 2000 + local_18;
    }
  }
  return local_18;
}

Assistant:

int borg_freedom(int y, int x)
{
    int d, f = 0;

    /* Hack -- chase down stairs in town */
    if (!borg.trait[BI_CDEPTH] && track_more.num) {
        /* Love the stairs! */
        d = double_distance(y, x, track_more.y[0], track_more.x[0]);

        /* Proximity is good */
        f += (1000 - d);

        /* Close proximity is great */
        if (d < 4)
            f += (2000 - (d * 500));
    }

    /* Hack -- chase Up Stairs in dungeon */
    if (borg.trait[BI_CDEPTH] && track_less.num) {
        /* Love the stairs! */
        d = double_distance(y, x, track_less.y[0], track_less.x[0]);

        /* Proximity is good */
        f += (1000 - d);

        /* Close proximity is great */
        if (d < 4)
            f += (2000 - (d * 500));
    }

    /* Freedom */
    return (f);
}